

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void __thiscall
leveldb::AddBoundaryInputsTest_TestEmptyLevelFiles_Test::
~AddBoundaryInputsTest_TestEmptyLevelFiles_Test
          (AddBoundaryInputsTest_TestEmptyLevelFiles_Test *this)

{
  AddBoundaryInputsTest_TestEmptyLevelFiles_Test *this_local;
  
  ~AddBoundaryInputsTest_TestEmptyLevelFiles_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(AddBoundaryInputsTest, TestEmptyLevelFiles) {
  FileMetaData* f1 =
      CreateFileMetaData(1, InternalKey("100", 2, kTypeValue),
                         InternalKey(InternalKey("100", 1, kTypeValue)));
  compaction_files_.push_back(f1);

  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_EQ(1, compaction_files_.size());
  ASSERT_EQ(f1, compaction_files_[0]);
  ASSERT_TRUE(level_files_.empty());
}